

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolact.cpp
# Opt level: O0

int detect_yolact(Mat *bgr,vector<Object,_std::allocator<Object>_> *objects)

{
  double dVar1;
  uchar uVar2;
  int iVar3;
  float *pfVar4;
  float *pfVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  uchar *puVar9;
  vector<Object,_std::allocator<Object>_> *in_RSI;
  long in_RDI;
  int x;
  uchar *bmp;
  float *mp2;
  int y;
  Mat mask2;
  int j_3;
  float *mp;
  float coeff;
  float *maskmap;
  int p_1;
  Mat mask_1;
  Object *obj_1;
  int i_3;
  int z;
  int j_2;
  vector<int,_std::allocator<int>_> picked;
  vector<Object,_std::allocator<Object>_> *candidates;
  int i_2;
  Object obj;
  float obj_y2;
  float obj_x2;
  float obj_y1;
  float obj_x1;
  float bbox_h;
  float bbox_w;
  float bbox_cy;
  float bbox_cx;
  float pb_h;
  float pb_w;
  float pb_cy;
  float pb_cx;
  float var [4];
  float class_score;
  int j_1;
  float score;
  int label;
  float *maskdata;
  float *pb_1;
  float *loc;
  float *conf;
  int i_1;
  vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  class_candidates;
  int keep_top_k;
  float nms_threshold;
  float confidence_thresh;
  float h;
  float w;
  float ar;
  int k;
  float cy;
  float cx;
  int j;
  int i;
  float scale;
  int conv_h;
  int conv_w;
  int p;
  float *pb;
  float scales [5];
  float aspect_ratios [3];
  int conv_hs [5];
  int conv_ws [5];
  Mat priorbox;
  int num_priors;
  int num_class;
  Mat confidence;
  Mat mask;
  Mat location;
  Mat maskmaps;
  Extractor ex;
  float norm_vals [3];
  float mean_vals [3];
  Mat in;
  int img_h;
  int img_w;
  int target_size;
  Net yolact;
  Mat *m;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffff49c;
  Object *this;
  value_type *in_stack_fffffffffffff4a8;
  vector<Object,_std::allocator<Object>_> *in_stack_fffffffffffff4b0;
  int in_stack_fffffffffffff4b8;
  int in_stack_fffffffffffff4bc;
  undefined4 in_stack_fffffffffffff4c0;
  int in_stack_fffffffffffff4c4;
  Mat *in_stack_fffffffffffff4c8;
  int in_stack_fffffffffffff4d0;
  int in_stack_fffffffffffff4d4;
  int in_stack_fffffffffffff4d8;
  int in_stack_fffffffffffff4dc;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffff4e0;
  void **ppvVar11;
  int in_stack_fffffffffffff500;
  Allocator *in_stack_fffffffffffff508;
  float **ppfVar12;
  undefined8 in_stack_fffffffffffff520;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff528;
  vector<Object,_std::allocator<Object>_> *in_stack_fffffffffffff530;
  int local_9b4;
  int local_99c;
  Scalar_ local_998 [32];
  Mat local_978 [96];
  Size_<int> local_918;
  undefined1 local_910 [24];
  _InputArray local_8f8;
  Mat local_8e0 [100];
  int local_87c;
  float local_86c;
  undefined8 local_868;
  undefined8 local_860;
  undefined8 local_858;
  undefined4 local_850;
  long *local_848;
  undefined4 local_840;
  undefined4 local_83c;
  undefined4 local_838;
  undefined4 local_834;
  undefined4 local_830;
  undefined8 local_828;
  void *local_820;
  int local_814;
  Scalar_ local_810 [32];
  Mat local_7f0 [16];
  long local_7e0;
  reference local_790;
  int local_784;
  int local_780;
  int local_77c;
  vector<int,_std::allocator<int>_> local_778;
  reference local_760;
  int local_758;
  Rect_<float> local_738;
  Rect_<float> local_728;
  int local_718;
  float local_714;
  float local_698;
  float local_694;
  float local_690;
  float local_68c;
  float local_688;
  float local_684;
  float local_680;
  float local_67c;
  float local_678;
  float local_674;
  float local_670;
  float local_66c;
  float local_668;
  float local_664;
  float local_660;
  float local_65c;
  float local_658;
  float local_654;
  float local_650;
  float local_64c;
  float local_648;
  float local_644;
  float local_640;
  float local_63c;
  undefined8 local_638;
  undefined8 uStack_630;
  float local_620;
  int local_61c;
  float local_618;
  int local_614;
  void *local_610;
  float *in_stack_fffffffffffff9f8;
  float *in_stack_fffffffffffffa00;
  Mat *in_stack_fffffffffffffa08;
  int local_5ec;
  vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  local_5e8;
  undefined4 local_5cc;
  undefined4 local_5c8;
  undefined4 local_5c4;
  float local_5c0;
  float local_5bc;
  float local_5b8;
  int local_5b4;
  float local_5b0;
  float local_5ac;
  int local_5a8;
  int local_5a4;
  float local_5a0;
  uint local_59c;
  int local_598;
  int local_594;
  float *local_590;
  float local_588 [5];
  uint local_574 [11];
  int local_548 [6];
  float *local_530;
  int *local_528;
  long local_520;
  undefined4 local_518;
  long *local_510;
  undefined4 local_508;
  int local_504;
  undefined4 local_500;
  undefined4 local_4fc;
  undefined4 local_4f8;
  undefined8 local_4f0;
  int local_4e8;
  int local_4e4;
  void *local_4e0;
  int *local_4d8;
  long local_4d0;
  undefined4 local_4c8;
  long *local_4c0;
  undefined4 local_4b8;
  int local_4b4;
  int local_4b0;
  undefined4 local_4ac;
  undefined4 local_4a8;
  undefined8 local_4a0;
  void *local_498;
  int *local_490;
  long local_488;
  undefined4 local_480;
  long *local_478;
  undefined4 local_470;
  int local_46c;
  undefined4 local_468;
  undefined4 local_464;
  undefined4 local_460;
  undefined8 local_458;
  void *local_450;
  int *local_448;
  long local_440;
  undefined4 local_438;
  long *local_430;
  undefined4 local_428;
  int local_424;
  undefined4 local_420;
  undefined4 local_41c;
  undefined4 local_418;
  undefined8 local_410;
  void *local_408;
  int *local_400;
  long local_3f8;
  undefined4 local_3f0;
  long *local_3e8;
  undefined4 local_3e0;
  int local_3dc;
  int local_3d8;
  undefined4 local_3d4;
  int local_3d0;
  long local_3c8;
  undefined8 local_3b0;
  undefined4 local_3a8;
  undefined8 local_3a0;
  undefined4 local_398;
  void *local_390;
  int *local_388;
  long *local_370;
  int local_348;
  int local_344;
  undefined4 local_340;
  undefined1 local_309;
  vector<Object,_std::allocator<Object>_> *local_2e0;
  long local_2d8;
  void **local_2d0;
  void **local_2c8;
  void **local_2c0;
  void **local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  int local_2a0;
  undefined4 local_29c;
  float **local_298;
  float **local_290;
  int local_284;
  void **local_280;
  int local_274;
  float **local_270;
  int local_264;
  void **local_260;
  int local_254;
  void **local_250;
  undefined1 local_245;
  int local_244;
  void **local_240;
  undefined8 *local_238;
  undefined8 *local_230;
  undefined8 *local_220;
  float **local_210;
  void **local_200;
  void **local_1f0;
  void **local_1e0;
  void **local_1d0;
  void **local_1c0;
  long *local_1b0;
  undefined4 local_1a4;
  long local_1a0;
  void *local_198;
  undefined4 local_18c;
  undefined8 *local_180;
  undefined4 local_174;
  long local_170;
  int local_158;
  undefined4 local_154;
  void **local_150;
  int local_138;
  undefined4 local_134;
  void **local_130;
  int local_118;
  undefined4 local_114;
  void **local_110;
  int local_f8;
  undefined4 local_f4;
  void **local_f0;
  int local_d8;
  undefined4 local_d4;
  void **local_d0;
  int local_b8;
  undefined4 local_b4;
  float **local_b0;
  undefined8 *local_90;
  float *local_60;
  void *local_50;
  void *local_40;
  void *local_30;
  void *local_20;
  
  local_2e0 = in_RSI;
  local_2d8 = in_RDI;
  ncnn::Net::Net((Net *)CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0));
  local_309 = 1;
  iVar3 = ncnn::Net::load_param
                    ((Net *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                     (char *)in_stack_fffffffffffff4b0);
  if (iVar3 != 0) {
    exit(-1);
  }
  iVar3 = ncnn::Net::load_model
                    ((Net *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                     (char *)in_stack_fffffffffffff4b0);
  if (iVar3 != 0) {
    exit(-1);
  }
  local_340 = 0x226;
  local_344 = *(int *)(local_2d8 + 0xc);
  local_348 = *(int *)(local_2d8 + 8);
  this = (Object *)0x0;
  uVar10 = 0x226;
  ncnn::Mat::from_pixels_resize
            ((uchar *)in_stack_fffffffffffff4e0,in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8,
             in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0,in_stack_fffffffffffff500,
             in_stack_fffffffffffff508);
  local_3a0 = 0x42e98f5c42f75c29;
  local_398 = 0x42cfe148;
  local_3b0 = 0x3c8f6ad93c8c4623;
  local_3a8 = 0x3c8ec47c;
  ncnn::Mat::substract_mean_normalize
            (in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  ncnn::Net::create_extractor((Net *)in_stack_fffffffffffff4a8);
  ncnn::Extractor::input
            ((Extractor *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8),
             (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
             in_stack_fffffffffffff4c8);
  local_2d0 = &local_408;
  local_408 = (void *)0x0;
  local_400 = (int *)0x0;
  local_3f8 = 0;
  local_3f0 = 0;
  local_3e8 = (long *)0x0;
  local_3e0 = 0;
  local_3dc = 0;
  local_3d8 = 0;
  local_3d4 = 0;
  local_3d0 = 0;
  local_3c8 = 0;
  local_2c8 = &local_450;
  local_450 = (void *)0x0;
  local_448 = (int *)0x0;
  local_440 = 0;
  local_438 = 0;
  local_430 = (long *)0x0;
  local_428 = 0;
  local_424 = 0;
  local_420 = 0;
  local_41c = 0;
  local_418 = 0;
  local_410 = 0;
  local_2c0 = &local_498;
  local_498 = (void *)0x0;
  local_490 = (int *)0x0;
  local_488 = 0;
  local_480 = 0;
  local_478 = (long *)0x0;
  local_470 = 0;
  local_46c = 0;
  local_468 = 0;
  local_464 = 0;
  local_460 = 0;
  local_458 = 0;
  local_2b8 = &local_4e0;
  local_4e0 = (void *)0x0;
  local_4d8 = (int *)0x0;
  local_4d0 = 0;
  local_4c8 = 0;
  local_4c0 = (long *)0x0;
  local_4b8 = 0;
  local_4b4 = 0;
  local_4b0 = 0;
  local_4ac = 0;
  local_4a8 = 0;
  local_4a0 = 0;
  ncnn::Extractor::extract
            ((Extractor *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8),
             (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
             in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c4);
  ncnn::Extractor::extract
            ((Extractor *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8),
             (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
             in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c4);
  ncnn::Extractor::extract
            ((Extractor *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8),
             (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
             in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c4);
  ncnn::Extractor::extract
            ((Extractor *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8),
             (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
             in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c4);
  local_4e4 = local_4b4;
  local_4e8 = local_4b0;
  local_298 = &local_530;
  local_29c = 4;
  local_2a0 = local_4b0;
  local_2a8 = 4;
  local_2b0 = 0;
  local_530 = (float *)0x0;
  local_528 = (int *)0x0;
  local_520 = 0;
  local_518 = 0;
  local_510 = (long *)0x0;
  local_508 = 0;
  local_504 = 0;
  local_500 = 0;
  local_4fc = 0;
  local_4f8 = 0;
  local_4f0 = 0;
  ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0),
                    in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8,
                    (size_t)in_stack_fffffffffffff4b0,(Allocator *)in_stack_fffffffffffff4a8);
  local_548[0] = 0x45;
  local_548[1] = 0x23;
  local_548[2] = 0x12;
  local_548[3] = 9;
  local_548[4] = 5;
  local_574[3] = 0x45;
  local_574[4] = 0x23;
  local_574[5] = 0x12;
  local_574[6] = 9;
  local_574[7] = 5;
  local_574[0] = 0x3f800000;
  local_574[1] = 0x3f000000;
  local_574[2] = 0x40000000;
  local_588[0] = 24.0;
  local_588[1] = 48.0;
  local_588[2] = 96.0;
  local_588[3] = 192.0;
  local_588[4] = 384.0;
  local_290 = &local_530;
  local_590 = local_530;
  for (local_594 = 0; local_594 < 5; local_594 = local_594 + 1) {
    local_598 = local_548[local_594];
    local_59c = local_574[(long)local_594 + 3];
    local_5a0 = local_588[local_594];
    for (local_5a4 = 0; local_5a4 < (int)local_59c; local_5a4 = local_5a4 + 1) {
      for (local_5a8 = 0; local_5a8 < local_598; local_5a8 = local_5a8 + 1) {
        local_5ac = ((float)local_5a8 + 0.5) / (float)local_598;
        local_5b0 = ((float)local_5a4 + 0.5) / (float)(int)local_59c;
        for (local_5b4 = 0; local_5b4 < 3; local_5b4 = local_5b4 + 1) {
          local_5b8 = (float)local_574[local_5b4];
          dVar1 = std::sqrt((double)(ulong)(uint)local_5b8);
          local_5b8 = SUB84(dVar1,0);
          local_5c0 = (local_5a0 * local_5b8) / 550.0;
          *local_590 = local_5ac;
          local_590[1] = local_5b0;
          local_590[2] = local_5c0;
          local_590[3] = local_5c0;
          local_590 = local_590 + 4;
          local_5bc = local_5c0;
        }
      }
    }
  }
  local_5c4 = 0x3d4ccccd;
  local_5c8 = 0x3f000000;
  local_5cc = 200;
  std::
  vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  ::vector((vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
            *)0x161423);
  std::
  vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  ::resize((vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
            *)CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0),
           CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8));
  for (local_5ec = 0; local_5ec < local_4e8; local_5ec = local_5ec + 1) {
    local_250 = &local_4e0;
    local_254 = local_5ec;
    local_260 = &local_450;
    local_264 = local_5ec;
    pfVar4 = (float *)((long)local_450 + (long)local_424 * (long)local_5ec * local_440);
    local_270 = &local_530;
    local_274 = local_5ec;
    pfVar5 = (float *)((long)local_530 + (long)local_504 * (long)local_5ec * local_520);
    local_280 = &local_498;
    local_284 = local_5ec;
    local_610 = (void *)((long)local_498 + (long)local_46c * (long)local_5ec * local_488);
    local_614 = 0;
    local_618 = 0.0;
    for (local_61c = 1; local_61c < local_4e4; local_61c = local_61c + 1) {
      local_620 = *(float *)((long)local_4e0 +
                            (long)local_61c * 4 + (long)local_4b4 * (long)local_5ec * local_4d0);
      if (local_618 < local_620) {
        local_614 = local_61c;
        local_618 = local_620;
      }
    }
    if ((local_614 != 0) && (0.05 < local_618)) {
      local_638 = 0x3dcccccd3dcccccd;
      uStack_630 = 0x3e4ccccd3e4ccccd;
      local_63c = *pfVar5;
      local_640 = pfVar5[1];
      local_644 = pfVar5[2];
      local_648 = pfVar5[3];
      local_64c = *pfVar4 * 0.1 * local_644 + local_63c;
      local_650 = pfVar4[1] * 0.1 * local_648 + local_640;
      dVar1 = std::exp((double)(ulong)(uint)(pfVar4[2] * 0.2));
      local_654 = SUB84(dVar1,0) * local_644;
      dVar1 = std::exp((double)(ulong)(uint)(uStack_630._4_4_ * pfVar4[3]));
      local_658 = SUB84(dVar1,0) * local_648;
      local_65c = local_64c - local_654 * 0.5;
      local_660 = local_650 - local_658 * 0.5;
      local_664 = local_654 * 0.5 + local_64c;
      local_668 = local_658 * 0.5 + local_650;
      local_66c = local_65c * (float)*(int *)(local_2d8 + 0xc);
      local_670 = (float)(*(int *)(local_2d8 + 0xc) + -1);
      pfVar4 = std::min<float>(&local_66c,&local_670);
      local_674 = 0.0;
      pfVar4 = std::max<float>(pfVar4,&local_674);
      local_65c = *pfVar4;
      local_678 = local_660 * (float)*(int *)(local_2d8 + 8);
      local_67c = (float)(*(int *)(local_2d8 + 8) + -1);
      pfVar4 = std::min<float>(&local_678,&local_67c);
      local_680 = 0.0;
      pfVar4 = std::max<float>(pfVar4,&local_680);
      local_660 = *pfVar4;
      local_684 = local_664 * (float)*(int *)(local_2d8 + 0xc);
      local_688 = (float)(*(int *)(local_2d8 + 0xc) + -1);
      pfVar4 = std::min<float>(&local_684,&local_688);
      local_68c = 0.0;
      pfVar4 = std::max<float>(pfVar4,&local_68c);
      local_664 = *pfVar4;
      local_690 = local_668 * (float)*(int *)(local_2d8 + 8);
      local_694 = (float)(*(int *)(local_2d8 + 8) + -1);
      pfVar4 = std::min<float>(&local_690,&local_694);
      local_698 = 0.0;
      pfVar4 = std::max<float>(pfVar4,&local_698);
      local_668 = *pfVar4;
      Object::Object(this);
      cv::Rect_<float>::Rect_
                (&local_738,local_65c,local_660,(local_664 - local_65c) + 1.0,
                 (local_668 - local_660) + 1.0);
      cv::Rect_<float>::operator=(&local_728,&local_738);
      local_718 = local_614;
      local_714 = local_618;
      std::allocator<float>::allocator((allocator<float> *)0x161bd1);
      std::vector<float,std::allocator<float>>::vector<float_const*,void>
                (in_stack_fffffffffffff4e0,
                 (float *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8),
                 (float *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
                 (allocator_type *)in_stack_fffffffffffff4c8);
      std::vector<float,_std::allocator<float>_>::operator=
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff4b0,
                 (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff4a8);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff4b0);
      std::allocator<float>::~allocator((allocator<float> *)0x161c2f);
      std::
      vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ::operator[](&local_5e8,(long)local_614);
      std::vector<Object,_std::allocator<Object>_>::push_back
                (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8);
      Object::~Object(this);
    }
  }
  std::vector<Object,_std::allocator<Object>_>::clear
            ((vector<Object,_std::allocator<Object>_> *)0x161ccf);
  for (local_758 = 0; iVar3 = local_758,
      sVar6 = std::
              vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
              ::size(&local_5e8), iVar3 < (int)sVar6; local_758 = local_758 + 1) {
    local_760 = std::
                vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                ::operator[](&local_5e8,(long)local_758);
    qsort_descent_inplace((vector<Object,_std::allocator<Object>_> *)this);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x161d48);
    nms_sorted_bboxes(in_stack_fffffffffffff530,in_stack_fffffffffffff528,
                      (float)((ulong)in_stack_fffffffffffff520 >> 0x20),
                      SUB81((ulong)in_stack_fffffffffffff520 >> 0x18,0));
    for (local_77c = 0; iVar3 = local_77c,
        sVar6 = std::vector<int,_std::allocator<int>_>::size(&local_778), iVar3 < (int)sVar6;
        local_77c = local_77c + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_778,(long)local_77c);
      local_780 = *pvVar7;
      std::vector<Object,_std::allocator<Object>_>::operator[](local_760,(long)local_780);
      std::vector<Object,_std::allocator<Object>_>::push_back
                (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8);
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff4b0);
  }
  qsort_descent_inplace((vector<Object,_std::allocator<Object>_> *)this);
  sVar6 = std::vector<Object,_std::allocator<Object>_>::size(local_2e0);
  if (200 < (int)sVar6) {
    std::vector<Object,_std::allocator<Object>_>::resize
              ((vector<Object,_std::allocator<Object>_> *)
               CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0),
               CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8));
  }
  for (local_784 = 0; iVar3 = local_784,
      sVar6 = std::vector<Object,_std::allocator<Object>_>::size(local_2e0), iVar3 < (int)sVar6;
      local_784 = local_784 + 1) {
    local_790 = std::vector<Object,_std::allocator<Object>_>::operator[](local_2e0,(long)local_784);
    cv::Mat::Mat(local_7f0,local_3d8,local_3dc,5);
    cv::Scalar_<double>::Scalar_
              ((Scalar_<double> *)this,(double)CONCAT44(in_stack_fffffffffffff49c,uVar10));
    cv::Mat::operator=(local_7f0,local_810);
    for (local_814 = 0; local_814 < local_3d0; local_814 = local_814 + 1) {
      local_238 = &local_868;
      local_240 = &local_408;
      local_820 = (void *)((long)local_408 + local_3c8 * local_814 * local_3f8);
      local_180 = &local_868;
      local_170 = (long)local_3dc * (long)local_3d8 * local_3f8;
      local_230 = &local_868;
      local_220 = &local_868;
      local_848 = local_3e8;
      local_174 = 0x10;
      local_18c = local_3d4;
      local_1a0 = local_3f8;
      local_1a4 = local_3f0;
      local_1b0 = local_3e8;
      local_244 = local_814;
      local_245 = 1;
      local_868 = 0;
      local_858 = 0;
      local_850 = 0;
      local_840 = 0;
      local_83c = 0;
      local_838 = 0;
      local_834 = 0;
      local_830 = 0;
      local_828 = 0;
      local_860 = 0;
      local_198 = local_820;
      local_90 = local_220;
      pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&local_790->maskdata,(long)local_814);
      local_86c = *pvVar8;
      for (local_87c = 0; local_87c < local_3dc * local_3d8; local_87c = local_87c + 1) {
        *(float *)(local_7e0 + (long)local_87c * 4) =
             *(float *)((long)local_820 + (long)local_87c * 4) * local_86c +
             *(float *)(local_7e0 + (long)local_87c * 4);
      }
    }
    cv::Mat::Mat(local_8e0);
    cv::_InputArray::_InputArray
              ((_InputArray *)this,(Mat *)CONCAT44(in_stack_fffffffffffff49c,uVar10));
    cv::_OutputArray::_OutputArray
              ((_OutputArray *)this,(Mat *)CONCAT44(in_stack_fffffffffffff49c,uVar10));
    cv::Size_<int>::Size_(&local_918,local_344,local_348);
    cv::resize(0,&local_8f8,local_910,&local_918);
    cv::_OutputArray::~_OutputArray((_OutputArray *)0x162518);
    cv::_InputArray::~_InputArray(&local_8f8);
    cv::Mat::Mat(local_978,local_348,local_344,0);
    cv::Mat::operator=(&local_790->mask,local_978);
    cv::Mat::~Mat(local_978);
    cv::Scalar_<double>::Scalar_
              ((Scalar_<double> *)this,(double)CONCAT44(in_stack_fffffffffffff49c,uVar10));
    cv::Mat::operator=(&local_790->mask,local_998);
    for (local_99c = 0; local_99c < local_348; local_99c = local_99c + 1) {
      if (((local_790->rect).y <= (float)local_99c) &&
         ((float)local_99c <= (local_790->rect).y + (local_790->rect).height)) {
        pfVar4 = cv::Mat::ptr<float_const>(local_8e0,local_99c);
        puVar9 = cv::Mat::ptr<unsigned_char>(&local_790->mask,local_99c);
        for (local_9b4 = 0; local_9b4 < local_344; local_9b4 = local_9b4 + 1) {
          if (((local_790->rect).x <= (float)local_9b4) &&
             ((float)local_9b4 <= (local_790->rect).x + (local_790->rect).width)) {
            uVar2 = '\0';
            if (0.5 < pfVar4[local_9b4]) {
              uVar2 = 0xff;
            }
            puVar9[local_9b4] = uVar2;
          }
        }
      }
    }
    cv::Mat::~Mat(local_8e0);
    cv::Mat::~Mat(local_7f0);
  }
  std::
  vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  ::~vector((vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
             *)in_stack_fffffffffffff4b0);
  ppfVar12 = &local_530;
  local_210 = ppfVar12;
  local_b0 = ppfVar12;
  if (local_528 != (int *)0x0) {
    local_b4 = 0xffffffff;
    LOCK();
    local_b8 = *local_528;
    *local_528 = *local_528 + -1;
    UNLOCK();
    if (local_b8 == 1) {
      if (local_510 == (long *)0x0) {
        local_60 = local_530;
        if (local_530 != (float *)0x0) {
          free(local_530);
        }
      }
      else {
        (**(code **)(*local_510 + 0x18))(local_510,local_530);
      }
    }
  }
  *ppfVar12 = (float *)0x0;
  ppfVar12[2] = (float *)0x0;
  *(undefined4 *)(ppfVar12 + 3) = 0;
  *(undefined4 *)(ppfVar12 + 5) = 0;
  *(undefined4 *)((long)ppfVar12 + 0x2c) = 0;
  *(undefined4 *)(ppfVar12 + 6) = 0;
  *(undefined4 *)((long)ppfVar12 + 0x34) = 0;
  *(undefined4 *)(ppfVar12 + 7) = 0;
  ppfVar12[8] = (float *)0x0;
  ppfVar12[1] = (float *)0x0;
  ppvVar11 = &local_4e0;
  local_200 = ppvVar11;
  local_d0 = ppvVar11;
  if (local_4d8 != (int *)0x0) {
    local_d4 = 0xffffffff;
    LOCK();
    local_d8 = *local_4d8;
    *local_4d8 = *local_4d8 + -1;
    UNLOCK();
    if (local_d8 == 1) {
      if (local_4c0 == (long *)0x0) {
        local_50 = local_4e0;
        if (local_4e0 != (void *)0x0) {
          free(local_4e0);
        }
      }
      else {
        (**(code **)(*local_4c0 + 0x18))(local_4c0,local_4e0);
      }
    }
  }
  *ppvVar11 = (void *)0x0;
  ppvVar11[2] = (void *)0x0;
  *(undefined4 *)(ppvVar11 + 3) = 0;
  *(undefined4 *)(ppvVar11 + 5) = 0;
  *(undefined4 *)((long)ppvVar11 + 0x2c) = 0;
  *(undefined4 *)(ppvVar11 + 6) = 0;
  *(undefined4 *)((long)ppvVar11 + 0x34) = 0;
  *(undefined4 *)(ppvVar11 + 7) = 0;
  ppvVar11[8] = (void *)0x0;
  ppvVar11[1] = (void *)0x0;
  local_1f0 = &local_498;
  local_f0 = local_1f0;
  if (local_490 != (int *)0x0) {
    local_f4 = 0xffffffff;
    LOCK();
    local_f8 = *local_490;
    *local_490 = *local_490 + -1;
    UNLOCK();
    if (local_f8 == 1) {
      if (local_478 == (long *)0x0) {
        local_40 = local_498;
        if (local_498 != (void *)0x0) {
          free(local_498);
        }
      }
      else {
        (**(code **)(*local_478 + 0x18))(local_478,local_498);
      }
    }
  }
  local_498 = (void *)0x0;
  local_488 = 0;
  local_480 = 0;
  local_470 = 0;
  local_468 = 0;
  local_464 = 0;
  local_460 = 0;
  local_458 = 0;
  local_490 = (int *)0x0;
  local_1e0 = &local_450;
  local_110 = local_1e0;
  if (local_448 != (int *)0x0) {
    local_114 = 0xffffffff;
    LOCK();
    local_118 = *local_448;
    *local_448 = *local_448 + -1;
    UNLOCK();
    if (local_118 == 1) {
      if (local_430 == (long *)0x0) {
        local_30 = local_450;
        if (local_450 != (void *)0x0) {
          free(local_450);
        }
      }
      else {
        (**(code **)(*local_430 + 0x18))(local_430,local_450);
      }
    }
  }
  local_450 = (void *)0x0;
  local_440 = 0;
  local_438 = 0;
  local_428 = 0;
  local_424 = 0;
  local_420 = 0;
  local_41c = 0;
  local_418 = 0;
  local_410 = 0;
  local_448 = (int *)0x0;
  local_1d0 = &local_408;
  local_130 = local_1d0;
  if (local_400 != (int *)0x0) {
    local_134 = 0xffffffff;
    LOCK();
    local_138 = *local_400;
    *local_400 = *local_400 + -1;
    UNLOCK();
    if (local_138 == 1) {
      if (local_3e8 == (long *)0x0) {
        local_20 = local_408;
        if (local_408 != (void *)0x0) {
          free(local_408);
        }
      }
      else {
        (**(code **)(*local_3e8 + 0x18))(local_3e8,local_408);
      }
    }
  }
  local_408 = (void *)0x0;
  local_3f8 = 0;
  local_3f0 = 0;
  local_3e0 = 0;
  local_3d4 = 0;
  local_3c8 = 0;
  local_400 = (int *)0x0;
  ncnn::Extractor::~Extractor((Extractor *)this);
  ppvVar11 = &local_390;
  local_1c0 = ppvVar11;
  local_150 = ppvVar11;
  if (local_388 != (int *)0x0) {
    local_154 = 0xffffffff;
    LOCK();
    local_158 = *local_388;
    *local_388 = *local_388 + -1;
    UNLOCK();
    if (local_158 == 1) {
      if (local_370 == (long *)0x0) {
        if (local_390 != (void *)0x0) {
          free(local_390);
        }
      }
      else {
        (**(code **)(*local_370 + 0x18))(local_370,local_390);
      }
    }
  }
  *ppvVar11 = (void *)0x0;
  ppvVar11[2] = (void *)0x0;
  *(undefined4 *)(ppvVar11 + 3) = 0;
  *(undefined4 *)(ppvVar11 + 5) = 0;
  *(undefined4 *)((long)ppvVar11 + 0x2c) = 0;
  *(undefined4 *)(ppvVar11 + 6) = 0;
  *(undefined4 *)((long)ppvVar11 + 0x34) = 0;
  *(undefined4 *)(ppvVar11 + 7) = 0;
  ppvVar11[8] = (void *)0x0;
  ppvVar11[1] = (void *)0x0;
  ncnn::Net::~Net((Net *)this);
  return 0;
}

Assistant:

static int detect_yolact(const cv::Mat& bgr, std::vector<Object>& objects)
{
    ncnn::Net yolact;

    yolact.opt.use_vulkan_compute = true;

    // original model converted from https://github.com/dbolya/yolact
    // yolact_resnet50_54_800000.pth
    // the ncnn model https://github.com/nihui/ncnn-assets/tree/master/models
    if (yolact.load_param("yolact.param"))
        exit(-1);
    if (yolact.load_model("yolact.bin"))
        exit(-1);

    const int target_size = 550;

    int img_w = bgr.cols;
    int img_h = bgr.rows;

    ncnn::Mat in = ncnn::Mat::from_pixels_resize(bgr.data, ncnn::Mat::PIXEL_BGR2RGB, img_w, img_h, target_size, target_size);

    const float mean_vals[3] = {123.68f, 116.78f, 103.94f};
    const float norm_vals[3] = {1.0 / 58.40f, 1.0 / 57.12f, 1.0 / 57.38f};
    in.substract_mean_normalize(mean_vals, norm_vals);

    ncnn::Extractor ex = yolact.create_extractor();

    ex.input("input.1", in);

    ncnn::Mat maskmaps;
    ncnn::Mat location;
    ncnn::Mat mask;
    ncnn::Mat confidence;

    ex.extract("619", maskmaps); // 138x138 x 32

    ex.extract("816", location);   // 4 x 19248
    ex.extract("818", mask);       // maskdim 32 x 19248
    ex.extract("820", confidence); // 81 x 19248

    int num_class = confidence.w;
    int num_priors = confidence.h;

    // make priorbox
    ncnn::Mat priorbox(4, num_priors);
    {
        const int conv_ws[5] = {69, 35, 18, 9, 5};
        const int conv_hs[5] = {69, 35, 18, 9, 5};

        const float aspect_ratios[3] = {1.f, 0.5f, 2.f};
        const float scales[5] = {24.f, 48.f, 96.f, 192.f, 384.f};

        float* pb = priorbox;

        for (int p = 0; p < 5; p++)
        {
            int conv_w = conv_ws[p];
            int conv_h = conv_hs[p];

            float scale = scales[p];

            for (int i = 0; i < conv_h; i++)
            {
                for (int j = 0; j < conv_w; j++)
                {
                    // +0.5 because priors are in center-size notation
                    float cx = (j + 0.5f) / conv_w;
                    float cy = (i + 0.5f) / conv_h;

                    for (int k = 0; k < 3; k++)
                    {
                        float ar = aspect_ratios[k];

                        ar = sqrt(ar);

                        float w = scale * ar / 550;
                        float h = scale / ar / 550;

                        // This is for backward compatibility with a bug where I made everything square by accident
                        // cfg.backbone.use_square_anchors:
                        h = w;

                        pb[0] = cx;
                        pb[1] = cy;
                        pb[2] = w;
                        pb[3] = h;

                        pb += 4;
                    }
                }
            }
        }
    }

    const float confidence_thresh = 0.05f;
    const float nms_threshold = 0.5f;
    const int keep_top_k = 200;

    std::vector<std::vector<Object> > class_candidates;
    class_candidates.resize(num_class);

    for (int i = 0; i < num_priors; i++)
    {
        const float* conf = confidence.row(i);
        const float* loc = location.row(i);
        const float* pb = priorbox.row(i);
        const float* maskdata = mask.row(i);

        // find class id with highest score
        // start from 1 to skip background
        int label = 0;
        float score = 0.f;
        for (int j = 1; j < num_class; j++)
        {
            float class_score = conf[j];
            if (class_score > score)
            {
                label = j;
                score = class_score;
            }
        }

        // ignore background or low score
        if (label == 0 || score <= confidence_thresh)
            continue;

        // CENTER_SIZE
        float var[4] = {0.1f, 0.1f, 0.2f, 0.2f};

        float pb_cx = pb[0];
        float pb_cy = pb[1];
        float pb_w = pb[2];
        float pb_h = pb[3];

        float bbox_cx = var[0] * loc[0] * pb_w + pb_cx;
        float bbox_cy = var[1] * loc[1] * pb_h + pb_cy;
        float bbox_w = (float)(exp(var[2] * loc[2]) * pb_w);
        float bbox_h = (float)(exp(var[3] * loc[3]) * pb_h);

        float obj_x1 = bbox_cx - bbox_w * 0.5f;
        float obj_y1 = bbox_cy - bbox_h * 0.5f;
        float obj_x2 = bbox_cx + bbox_w * 0.5f;
        float obj_y2 = bbox_cy + bbox_h * 0.5f;

        // clip
        obj_x1 = std::max(std::min(obj_x1 * bgr.cols, (float)(bgr.cols - 1)), 0.f);
        obj_y1 = std::max(std::min(obj_y1 * bgr.rows, (float)(bgr.rows - 1)), 0.f);
        obj_x2 = std::max(std::min(obj_x2 * bgr.cols, (float)(bgr.cols - 1)), 0.f);
        obj_y2 = std::max(std::min(obj_y2 * bgr.rows, (float)(bgr.rows - 1)), 0.f);

        // append object
        Object obj;
        obj.rect = cv::Rect_<float>(obj_x1, obj_y1, obj_x2 - obj_x1 + 1, obj_y2 - obj_y1 + 1);
        obj.label = label;
        obj.prob = score;
        obj.maskdata = std::vector<float>(maskdata, maskdata + mask.w);

        class_candidates[label].push_back(obj);
    }

    objects.clear();
    for (int i = 0; i < (int)class_candidates.size(); i++)
    {
        std::vector<Object>& candidates = class_candidates[i];

        qsort_descent_inplace(candidates);

        std::vector<int> picked;
        nms_sorted_bboxes(candidates, picked, nms_threshold);

        for (int j = 0; j < (int)picked.size(); j++)
        {
            int z = picked[j];
            objects.push_back(candidates[z]);
        }
    }

    qsort_descent_inplace(objects);

    // keep_top_k
    if (keep_top_k < (int)objects.size())
    {
        objects.resize(keep_top_k);
    }

    // generate mask
    for (int i = 0; i < (int)objects.size(); i++)
    {
        Object& obj = objects[i];

        cv::Mat mask(maskmaps.h, maskmaps.w, CV_32FC1);
        {
            mask = cv::Scalar(0.f);

            for (int p = 0; p < maskmaps.c; p++)
            {
                const float* maskmap = maskmaps.channel(p);
                float coeff = obj.maskdata[p];
                float* mp = (float*)mask.data;

                // mask += m * coeff
                for (int j = 0; j < maskmaps.w * maskmaps.h; j++)
                {
                    mp[j] += maskmap[j] * coeff;
                }
            }
        }

        cv::Mat mask2;
        cv::resize(mask, mask2, cv::Size(img_w, img_h));

        // crop obj box and binarize
        obj.mask = cv::Mat(img_h, img_w, CV_8UC1);
        {
            obj.mask = cv::Scalar(0);

            for (int y = 0; y < img_h; y++)
            {
                if (y < obj.rect.y || y > obj.rect.y + obj.rect.height)
                    continue;

                const float* mp2 = mask2.ptr<const float>(y);
                uchar* bmp = obj.mask.ptr<uchar>(y);

                for (int x = 0; x < img_w; x++)
                {
                    if (x < obj.rect.x || x > obj.rect.x + obj.rect.width)
                        continue;

                    bmp[x] = mp2[x] > 0.5f ? 255 : 0;
                }
            }
        }
    }

    return 0;
}